

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::NameShadowingChecker::loadBindings(NameShadowingChecker *this,HSQOBJECT *bindings)

{
  SQTable *this_00;
  SQObjectValue SVar1;
  SQObjectValue SVar2;
  SymbolInfo *info;
  SQObjectPtr key;
  SQObjectPtr pos;
  SQObjectPtr val;
  
  if ((bindings != (HSQOBJECT *)0x0) && (bindings->_type == OT_TABLE)) {
    this_00 = (bindings->_unVal).pTable;
    pos.super_SQObject._type = OT_INTEGER;
    pos.super_SQObject._flags = '\0';
    pos.super_SQObject._unVal.pTable = (SQTable *)0x0;
    key.super_SQObject._unVal.pTable = (SQTable *)0x0;
    key.super_SQObject._type = OT_NULL;
    key.super_SQObject._flags = '\0';
    key.super_SQObject._5_3_ = 0;
    val.super_SQObject._unVal.pTable = (SQTable *)0x0;
    val.super_SQObject._type = OT_NULL;
    val.super_SQObject._flags = '\0';
    val.super_SQObject._5_3_ = 0;
    SVar2.pTable = pos.super_SQObject._unVal.pTable;
    while (pos.super_SQObject._unVal = SVar2,
          SVar2.nInteger = SQTable::Next(this_00,false,&pos,&key,&val),
          SVar1 = key.super_SQObject._unVal, -1 < SVar2.nInteger) {
      if (key.super_SQObject._type == OT_STRING) {
        info = newSymbolInfo(this,SK_EXTERNAL_BINDING);
        declareSymbol(this,(SVar1.pString)->_val,info);
      }
    }
    SQObjectPtr::~SQObjectPtr(&val);
    SQObjectPtr::~SQObjectPtr(&key);
    SQObjectPtr::~SQObjectPtr(&pos);
  }
  return;
}

Assistant:

void NameShadowingChecker::loadBindings(const HSQOBJECT *bindings) {
  if (bindings && sq_istable(*bindings)) {
    SQTable *table = _table(*bindings);

    SQInteger idx = 0;
    SQObjectPtr pos(idx), key, val;

    while ((idx = table->Next(false, pos, key, val)) >= 0) {
      if (sq_isstring(key)) {
        const SQChar *s = _string(key)->_val;
        SymbolInfo *info = newSymbolInfo(SK_EXTERNAL_BINDING);
        declareSymbol(s, info);
      }
      pos._unVal.nInteger = idx;
    }
  }
}